

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O1

ktx_error_code_e ktxMemStream_setpos(ktxStream *str,ktx_off_t pos)

{
  ktx_error_code_e kVar1;
  
  if (str == (ktxStream *)0x0) {
    return KTX_INVALID_VALUE;
  }
  if (str->type == eStreamTypeMemory) {
    kVar1 = KTX_INVALID_OPERATION;
    if ((-1 < pos) && ((ulong)pos <= ((str->data).mem)->alloc_size)) {
      ((str->data).mem)->pos = pos;
      kVar1 = KTX_SUCCESS;
    }
    return kVar1;
  }
  __assert_fail("str->type == eStreamTypeMemory",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/memstream.c"
                ,0x185,"ktx_error_code_e ktxMemStream_setpos(ktxStream *, ktx_off_t)");
}

Assistant:

static
KTX_error_code ktxMemStream_setpos(ktxStream* str, ktx_off_t pos)
{
    if (!str)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeMemory);

    if (pos < 0 || (ktx_size_t)pos > str->data.mem->alloc_size)
        return KTX_INVALID_OPERATION;

    str->data.mem->pos = pos;
    return KTX_SUCCESS;
}